

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O2

void sc_entry(GlobalVars *gv)

{
  bool bVar1;
  uint uVar2;
  char *s;
  char *pcVar3;
  
  bVar1 = startofblock('(');
  if (bVar1 != 0) {
    s = getarg('\x03');
    pcVar3 = scriptname;
    if (s == (char *)0x0) {
      uVar2 = getlineno();
      error(0x4e,pcVar3,(ulong)uVar2);
    }
    else if (gv->entry_name == (char *)0x0) {
      pcVar3 = allocstring(s);
      gv->entry_name = pcVar3;
    }
    endofblock('(',')');
    return;
  }
  return;
}

Assistant:

static void sc_entry(struct GlobalVars *gv)
/* ENTRY(symbol or address) */
{
  if (startofblock('(')) {
    char *entryname;

    if (entryname = getalnum()) {
      if (gv->entry_name == NULL)
        gv->entry_name = allocstring(entryname);
    }
    else
      error(78,scriptname,getlineno());
    endofblock('(',')');
  }
}